

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenRegVm_X86.cpp
# Opt level: O2

void GenCodeLoadInt32FromPointer
               (CodeGenRegVmContext *ctx,x86Reg tempReg,x86Reg targetReg,uchar reg,uint offset)

{
  uint num;
  int iVar1;
  undefined7 in_register_00000009;
  x86Reg xStack_30;
  
  iVar1 = (int)CONCAT71(in_register_00000009,reg);
  if (iVar1 == 1) {
    xStack_30 = rR15;
    tempReg = xStack_30;
  }
  else {
    if (iVar1 == 2) {
      num = *(uint *)((long)ctx->exRegVmConstants + (ulong)(offset & 0xfffffffc));
      if (num == 0) {
        EMIT_OP_REG_REG(&ctx->ctx,o_xor,targetReg,targetReg);
        return;
      }
      EMIT_OP_REG_NUM(&ctx->ctx,o_mov,targetReg,num);
      return;
    }
    if (iVar1 == 3) {
      xStack_30 = rEBX;
      tempReg = xStack_30;
    }
    else {
      EMIT_OP_REG_RPTR(&ctx->ctx,o_mov64,tempReg,sQWORD,rEBX,(uint)reg << 3);
    }
  }
  EMIT_OP_REG_RPTR(&ctx->ctx,o_mov,targetReg,sDWORD,tempReg,offset);
  return;
}

Assistant:

void GenCodeLoadInt32FromPointer(CodeGenRegVmContext &ctx, x86Reg tempReg, x86Reg targetReg, unsigned char reg, unsigned offset)
{
	if(reg == rvrrRegisters)
	{
		EMIT_OP_REG_RPTR(ctx.ctx, o_mov, targetReg, sDWORD, rREG, offset); // Load int value
	}
	else if(reg == rvrrFrame)
	{
		EMIT_OP_REG_RPTR(ctx.ctx, o_mov, targetReg, sDWORD, rR15, offset); // Load int value
	}
	else if(reg == rvrrConstants)
	{
		// Load int immediate
		int value = ctx.exRegVmConstants[offset >> 2];

		if(value == 0)
			EMIT_OP_REG_REG(ctx.ctx, o_xor, targetReg, targetReg);
		else
			EMIT_OP_REG_NUM(ctx.ctx, o_mov, targetReg, value);
	}
	else
	{
		EMIT_OP_REG_RPTR(ctx.ctx, o_mov64, tempReg, sQWORD, rREG, reg * 8); // Load source pointer
		EMIT_OP_REG_RPTR(ctx.ctx, o_mov, targetReg, sDWORD, tempReg, offset); // Load int value
	}
}